

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_icu::raii_casemap::raii_casemap(raii_casemap *this,string *locale_id)

{
  int iVar1;
  UCaseMap *pUVar2;
  char *pcVar3;
  runtime_error *prVar4;
  UErrorCode err;
  allocator local_45;
  int local_44;
  string local_40;
  
  this->map_ = (UCaseMap *)0x0;
  local_44 = 0;
  pUVar2 = (UCaseMap *)ucasemap_open_70((locale_id->_M_dataplus)._M_p,0,&local_44);
  iVar1 = local_44;
  this->map_ = pUVar2;
  if (0 < local_44) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
    pcVar3 = (char *)u_errorName_70(iVar1);
    std::__cxx11::string::string((string *)&local_40,pcVar3,&local_45);
    runtime_error::runtime_error(prVar4,&local_40);
    __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  if (pUVar2 != (UCaseMap *)0x0) {
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to create UCaseMap","");
  runtime_error::runtime_error(prVar4,&local_40);
  __cxa_throw(prVar4,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

raii_casemap(std::string const &locale_id) :
            map_(0)
        {
            UErrorCode err=U_ZERO_ERROR;
            map_ = ucasemap_open(locale_id.c_str(),0,&err);
            check_and_throw_icu_error(err);
            if(!map_)
                throw booster::runtime_error("Failed to create UCaseMap");
        }